

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureOneFailureAndOneSuccess::RunImpl
          (TestXmlTestReporterFixtureOneFailureAndOneSuccess *this)

{
  TestDetails *details;
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper fixtureHelper;
  XmlTestReporterFixtureOneFailureAndOneSuccessHelper XStack_1d8;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture(&XStack_1d8.super_XmlTestReporterFixture);
  XStack_1d8.m_details = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureOneFailureAndOneSuccessHelper>
            (&XStack_1d8,details);
  XmlTestReporterFixture::~XmlTestReporterFixture(&XStack_1d8.super_XmlTestReporterFixture);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, OneFailureAndOneSuccess)
{
    TestDetails const failedDetails("FailedTest", "suite", "fail.h", 1);
    reporter.ReportTestStart(failedDetails);
    reporter.ReportFailure(failedDetails, "expected 1 but was 2");
    reporter.ReportTestFinish(failedDetails, 0.1f);

    TestDetails const succeededDetails("SucceededTest", "suite", "", 0);
    reporter.ReportTestStart(succeededDetails);
    reporter.ReportTestFinish(succeededDetails, 1.0f);
    reporter.ReportSummary(2, 1, 1, 1.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"2\" failedtests=\"1\" failures=\"1\" time=\"1.1\">"
        "<test suite=\"suite\" name=\"FailedTest\" time=\"0.1\">"
        "<failure message=\"fail.h(1) : expected 1 but was 2\"/>"
        "</test>"
        "<test suite=\"suite\" name=\"SucceededTest\" time=\"1\"/>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}